

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkState.cpp
# Opt level: O0

void __thiscall iDynTree::LinkPositions::~LinkPositions(LinkPositions *this)

{
  vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *unaff_retaddr;
  size_t in_stack_00000058;
  LinkPositions *in_stack_00000060;
  
  resize(in_stack_00000060,in_stack_00000058);
  std::vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

LinkPositions::~LinkPositions()
{
    resize(0);
}